

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  long lVar3;
  allocator<char> local_59;
  value_type local_58;
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->filenames);
  this->showindex_flag = false;
  this->showheader_flag = false;
  this->showid_flag = false;
  this->showdescriptor_flag = false;
  this->showcoding_flag = false;
  this->showrate_flag = false;
  this->max_bitrate_flag = false;
  this->max_bitrate = 0.0;
  local_24 = 1;
  do {
    if (argv_local._4_4_ <= local_24) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->filenames);
        if (bVar1) {
          fputs("At least one filename argument is required.\n",_stderr);
        }
        else {
          this->error_flag = false;
        }
      }
      return;
    }
    iVar2 = strcmp(ppcStack_20[local_24],"-help");
    if (iVar2 == 0) {
      this->help_flag = true;
    }
    else if ((*ppcStack_20[local_24] == '-') &&
            (((iVar2 = isalpha((int)ppcStack_20[local_24][1]), iVar2 != 0 ||
              (iVar2 = isdigit((int)ppcStack_20[local_24][1]), iVar2 != 0)) &&
             (ppcStack_20[local_24][2] == '\0')))) {
      switch(ppcStack_20[local_24][1]) {
      case 'H':
        this->showheader_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",ppcStack_20[local_24]);
        return;
      case 'V':
        this->version_flag = true;
        break;
      case 'c':
        this->showcoding_flag = true;
        break;
      case 'd':
        this->showdescriptor_flag = true;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'i':
        this->showid_flag = true;
        break;
      case 'n':
        this->showindex_flag = true;
        break;
      case 'r':
        this->showrate_flag = true;
        break;
      case 't':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x74);
          return;
        }
        lVar3 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar3 = Kumu::xabs<long>(lVar3);
        this->max_bitrate = (double)lVar3;
        this->max_bitrate_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
      }
    }
    else {
      if (*ppcStack_20[local_24] == '-') {
        fprintf(_stderr,"Unrecognized argument: %s\n",ppcStack_20[local_24]);
        return;
      }
      __s = ppcStack_20[local_24];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->filenames,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), help_flag(false), verbose_flag(false),
    showindex_flag(false), showheader_flag(false),
    showid_flag(false), showdescriptor_flag(false), showcoding_flag(false),
    showrate_flag(false), max_bitrate_flag(false), max_bitrate(0.0)
  {
    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': showcoding_flag = true; break;
	      case 'd': showdescriptor_flag = true; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': showid_flag = true; break;
	      case 'n': showindex_flag = true; break;
	      case 'r': showrate_flag = true; break;

	      case 't':
		TEST_EXTRA_ARG(i, 't');
		max_bitrate = Kumu::xabs(strtol(argv[i], 0, 10));
		max_bitrate_flag = true;
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( filenames.empty() )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    error_flag = false;
  }